

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::ExtensionSet::SwapExtension
          (ExtensionSet *this,ExtensionSet *other,int number)

{
  bool bVar1;
  undefined1 uVar2;
  bool bVar3;
  Extension *pEVar4;
  Extension *pEVar5;
  Arena *pAVar6;
  Arena *pAVar7;
  ExtensionSet *in_RSI;
  ExtensionSet *in_RDI;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar8;
  ExtensionSet *unaff_retaddr;
  Extension *temp_ext;
  ExtensionSet temp;
  Extension *other_ext;
  Extension *this_ext;
  Extension *in_stack_000002a0;
  int in_stack_000002ac;
  ExtensionSet *in_stack_000002b0;
  Extension *in_stack_ffffffffffffff40;
  ExtensionSet *in_stack_ffffffffffffff48;
  int iVar9;
  ExtensionSet *in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff90;
  undefined7 in_stack_ffffffffffffff91;
  ExtensionSet *pEVar10;
  int iVar11;
  
  if (in_RDI != in_RSI) {
    pEVar10 = in_RDI;
    pEVar4 = FindOrNull(in_stack_ffffffffffffff48,(int)((ulong)in_stack_ffffffffffffff40 >> 0x20));
    iVar11 = (int)((ulong)pEVar10 >> 0x20);
    pEVar5 = FindOrNull(in_stack_ffffffffffffff48,(int)((ulong)in_stack_ffffffffffffff40 >> 0x20));
    if ((pEVar4 != (Extension *)0x0) || (pEVar5 != (Extension *)0x0)) {
      if ((pEVar4 == (Extension *)0x0) || (pEVar5 == (Extension *)0x0)) {
        if (pEVar4 == (Extension *)0x0) {
          pAVar6 = GetArenaNoVirtual(in_RDI);
          iVar9 = (int)((ulong)in_stack_ffffffffffffff48 >> 0x20);
          pAVar7 = GetArenaNoVirtual(in_RSI);
          if (pAVar6 == pAVar7) {
            pVar8 = Insert(unaff_retaddr,iVar11);
            pEVar4 = pVar8.first;
            pEVar4->field_0 = pEVar5->field_0;
            bVar1 = pEVar5->is_repeated;
            uVar2 = pEVar5->field_0xa;
            bVar3 = pEVar5->is_packed;
            iVar11 = pEVar5->cached_size;
            pEVar4->type = pEVar5->type;
            pEVar4->is_repeated = bVar1;
            pEVar4->field_0xa = uVar2;
            pEVar4->is_packed = bVar3;
            pEVar4->cached_size = iVar11;
            pEVar4->descriptor = pEVar5->descriptor;
          }
          else {
            InternalExtensionMergeFrom(in_stack_000002b0,in_stack_000002ac,in_stack_000002a0);
          }
          Erase(in_stack_ffffffffffffff50,iVar9);
        }
        else if (pEVar5 == (Extension *)0x0) {
          pAVar6 = GetArenaNoVirtual(in_RDI);
          iVar9 = (int)((ulong)in_stack_ffffffffffffff48 >> 0x20);
          pAVar7 = GetArenaNoVirtual(in_RSI);
          if (pAVar6 == pAVar7) {
            pVar8 = Insert(unaff_retaddr,iVar11);
            pEVar5 = pVar8.first;
            pEVar5->field_0 = pEVar4->field_0;
            bVar1 = pEVar4->is_repeated;
            uVar2 = pEVar4->field_0xa;
            bVar3 = pEVar4->is_packed;
            iVar11 = pEVar4->cached_size;
            pEVar5->type = pEVar4->type;
            pEVar5->is_repeated = bVar1;
            pEVar5->field_0xa = uVar2;
            pEVar5->is_packed = bVar3;
            pEVar5->cached_size = iVar11;
            pEVar5->descriptor = pEVar4->descriptor;
          }
          else {
            InternalExtensionMergeFrom(in_stack_000002b0,in_stack_000002ac,in_stack_000002a0);
          }
          Erase(in_stack_ffffffffffffff50,iVar9);
        }
      }
      else {
        pAVar6 = GetArenaNoVirtual(in_RDI);
        pAVar7 = GetArenaNoVirtual(in_RSI);
        if (pAVar6 == pAVar7) {
          std::swap<google::protobuf::internal::ExtensionSet::Extension>(pEVar4,pEVar5);
        }
        else {
          ExtensionSet((ExtensionSet *)CONCAT71(in_stack_ffffffffffffff91,in_stack_ffffffffffffff90)
                      );
          InternalExtensionMergeFrom(in_stack_000002b0,in_stack_000002ac,in_stack_000002a0);
          FindOrNull(in_stack_ffffffffffffff48,(int)((ulong)in_stack_ffffffffffffff40 >> 0x20));
          Extension::Clear(in_stack_ffffffffffffff40);
          InternalExtensionMergeFrom(in_stack_000002b0,in_stack_000002ac,in_stack_000002a0);
          Extension::Clear(in_stack_ffffffffffffff40);
          InternalExtensionMergeFrom(in_stack_000002b0,in_stack_000002ac,in_stack_000002a0);
          ~ExtensionSet((ExtensionSet *)in_stack_ffffffffffffff40);
        }
      }
    }
  }
  return;
}

Assistant:

void ExtensionSet::SwapExtension(ExtensionSet* other, int number) {
  if (this == other) return;
  Extension* this_ext = FindOrNull(number);
  Extension* other_ext = other->FindOrNull(number);

  if (this_ext == NULL && other_ext == NULL) {
    return;
  }

  if (this_ext != NULL && other_ext != NULL) {
    if (GetArenaNoVirtual() == other->GetArenaNoVirtual()) {
      using std::swap;
      swap(*this_ext, *other_ext);
    } else {
      // TODO(cfallin, rohananil): We could further optimize these cases,
      // especially avoid creation of ExtensionSet, and move MergeFrom logic
      // into Extensions itself (which takes arena as an argument).
      // We do it this way to reuse the copy-across-arenas logic already
      // implemented in ExtensionSet's MergeFrom.
      ExtensionSet temp;
      temp.InternalExtensionMergeFrom(number, *other_ext);
      Extension* temp_ext = temp.FindOrNull(number);
      other_ext->Clear();
      other->InternalExtensionMergeFrom(number, *this_ext);
      this_ext->Clear();
      InternalExtensionMergeFrom(number, *temp_ext);
    }
    return;
  }

  if (this_ext == NULL) {
    if (GetArenaNoVirtual() == other->GetArenaNoVirtual()) {
      *Insert(number).first = *other_ext;
    } else {
      InternalExtensionMergeFrom(number, *other_ext);
    }
    other->Erase(number);
    return;
  }

  if (other_ext == NULL) {
    if (GetArenaNoVirtual() == other->GetArenaNoVirtual()) {
      *other->Insert(number).first = *this_ext;
    } else {
      other->InternalExtensionMergeFrom(number, *this_ext);
    }
    Erase(number);
    return;
  }
}